

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O1

void htmlAutoClose(htmlParserCtxtPtr ctxt,xmlChar *newtag)

{
  endElementSAXFunc p_Var1;
  int iVar2;
  long lVar3;
  xmlChar *pxVar4;
  
  while( true ) {
    if (newtag == (xmlChar *)0x0) {
      htmlAutoCloseOnEnd(ctxt);
      return;
    }
    if ((ctxt->name == (xmlChar *)0x0) ||
       (iVar2 = htmlCheckAutoClose(newtag,ctxt->name), iVar2 == 0)) break;
    if ((ctxt->sax != (_xmlSAXHandler *)0x0) &&
       (p_Var1 = ctxt->sax->endElement, p_Var1 != (endElementSAXFunc)0x0)) {
      (*p_Var1)(ctxt->userData,ctxt->name);
    }
    iVar2 = ctxt->nameNr;
    lVar3 = (long)iVar2;
    if (0 < lVar3) {
      ctxt->nameNr = iVar2 + -1;
      if (iVar2 == 1) {
        pxVar4 = (xmlChar *)0x0;
      }
      else {
        pxVar4 = ctxt->nameTab[lVar3 + -2];
      }
      ctxt->name = pxVar4;
      ctxt->nameTab[lVar3 + -1] = (xmlChar *)0x0;
    }
  }
  return;
}

Assistant:

static void
htmlAutoClose(htmlParserCtxtPtr ctxt, const xmlChar * newtag)
{
    while ((newtag != NULL) && (ctxt->name != NULL) &&
           (htmlCheckAutoClose(newtag, ctxt->name))) {
        if ((ctxt->sax != NULL) && (ctxt->sax->endElement != NULL))
            ctxt->sax->endElement(ctxt->userData, ctxt->name);
	htmlnamePop(ctxt);
    }
    if (newtag == NULL) {
        htmlAutoCloseOnEnd(ctxt);
        return;
    }
    while ((newtag == NULL) && (ctxt->name != NULL) &&
           ((xmlStrEqual(ctxt->name, BAD_CAST "head")) ||
            (xmlStrEqual(ctxt->name, BAD_CAST "body")) ||
            (xmlStrEqual(ctxt->name, BAD_CAST "html")))) {
        if ((ctxt->sax != NULL) && (ctxt->sax->endElement != NULL))
            ctxt->sax->endElement(ctxt->userData, ctxt->name);
	htmlnamePop(ctxt);
    }
}